

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O3

string * duckdb::Binder::ReplaceColumnsAlias
                   (string *__return_storage_ptr__,string *alias,string *column_name,
                   optional_ptr<duckdb_re2::RE2,_true> regex)

{
  char cVar1;
  pointer pcVar2;
  optional_ptr<duckdb_re2::RE2,_true> re;
  ulong uVar3;
  long *plVar4;
  BinderException *pBVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  string extracted;
  string local_100;
  optional_ptr<duckdb_re2::RE2,_true> local_e0;
  long *local_d8;
  size_type local_d0;
  long local_c8;
  long lStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  StringPiece local_b0;
  StringPiece local_a0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_e0.ptr = regex.ptr;
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar3 = alias->_M_string_length;
  if (uVar3 != 0) {
    uVar8 = 0;
    do {
      paVar7 = &local_100.field_2;
      pcVar2 = (alias->_M_dataplus)._M_p;
      if (pcVar2[uVar8] == '\\') {
        uVar8 = uVar8 + 1;
        if (uVar3 <= uVar8) {
          pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
          local_100._M_dataplus._M_p = (pointer)paVar7;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,
                     "Unterminated backslash in COLUMNS(*) \"%s\" alias. Backslashes must either be escaped or followed by a number"
                     ,"");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar2 = (alias->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + alias->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>(pBVar5,&local_100,&local_50);
          __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        cVar1 = pcVar2[uVar8];
        if (cVar1 == '\\') {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          if ((byte)(cVar1 - 0x3aU) < 0xf6) {
            pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
            local_100._M_dataplus._M_p = (pointer)paVar7;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,
                       "Invalid backslash code in COLUMNS(*) \"%s\" alias. Backslashes must either be escaped or followed by a number"
                       ,"");
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar2 = (alias->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar2,pcVar2 + alias->_M_string_length);
            BinderException::BinderException<std::__cxx11::string>(pBVar5,&local_100,&local_70);
            __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (cVar1 == '0') {
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)(column_name->_M_dataplus)._M_p);
          }
          else {
            if (local_e0.ptr == (RE2 *)0x0) {
              pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
              local_100._M_dataplus._M_p = (pointer)paVar7;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_100,
                         "Only the backslash escape code \\0 can be used when no regex is supplied to COLUMNS(*)"
                         ,"");
              BinderException::BinderException(pBVar5,&local_100);
              __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            local_100._M_string_length = 0;
            local_100.field_2._M_local_buf[0] = '\0';
            local_a0.data_ = (column_name->_M_dataplus)._M_p;
            local_a0.size_ = column_name->_M_string_length;
            local_100._M_dataplus._M_p = (pointer)paVar7;
            optional_ptr<duckdb_re2::RE2,_true>::CheckValid(&local_e0);
            re.ptr = local_e0.ptr;
            ::std::__cxx11::string::substr((ulong)local_90,(ulong)alias);
            plVar4 = (long *)::std::__cxx11::string::replace
                                       ((ulong)local_90,0,(char *)0x0,0x1e6d232);
            local_d8 = &local_c8;
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_c8 = *plVar6;
              lStack_c0 = plVar4[3];
            }
            else {
              local_c8 = *plVar6;
              local_d8 = (long *)*plVar4;
            }
            local_d0 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            local_b0.data_ = (const_pointer)local_d8;
            local_b0.size_ = local_d0;
            duckdb_re2::RE2::Extract(&local_a0,re.ptr,&local_b0,&local_100);
            if (local_d8 != &local_c8) {
              operator_delete(local_d8);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0]);
            }
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_100._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar8 = uVar8 + 1;
      uVar3 = alias->_M_string_length;
    } while (uVar8 < uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string Binder::ReplaceColumnsAlias(const string &alias, const string &column_name,
                                   optional_ptr<duckdb_re2::RE2> regex) {
	string result;
	result.reserve(alias.size());
	for (idx_t c = 0; c < alias.size(); c++) {
		if (alias[c] == '\\') {
			c++;
			if (c >= alias.size()) {
				throw BinderException("Unterminated backslash in COLUMNS(*) \"%s\" alias. Backslashes must either be "
				                      "escaped or followed by a number",
				                      alias);
			}
			if (alias[c] == '\\') {
				result += "\\";
				continue;
			}
			if (alias[c] < '0' || alias[c] > '9') {
				throw BinderException("Invalid backslash code in COLUMNS(*) \"%s\" alias. Backslashes must either be "
				                      "escaped or followed by a number",
				                      alias);
			}
			if (alias[c] == '0') {
				result += column_name;
			} else if (!regex) {
				throw BinderException(
				    "Only the backslash escape code \\0 can be used when no regex is supplied to COLUMNS(*)");
			} else {
				string extracted;
				RE2::Extract(column_name, *regex, "\\" + alias.substr(c, 1), &extracted);
				result += extracted;
			}
		} else {
			result += alias[c];
		}
	}
	return result;
}